

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O1

bool __thiscall
YAML::detail::node::equals<std::__cxx11::string>
          (node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,
          shared_memory_holder *pMemory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lhs;
  string local_88;
  Node local_68;
  
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (pMemory->super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  this_00 = (pMemory->super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  paVar1 = &local_68.m_invalidKey.field_2;
  local_68.m_isValid = true;
  local_68.m_invalidKey._M_string_length = 0;
  local_68.m_invalidKey.field_2._M_local_buf[0] = '\0';
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_68.m_invalidKey._M_dataplus._M_p = (pointer)paVar1;
  local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_00;
  local_68.m_pNode = this;
  bVar2 = convert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(&local_68,&local_88);
  if (local_68.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_invalidKey._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.m_invalidKey._M_dataplus._M_p);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((bVar2) && (local_88._M_string_length == rhs->_M_string_length)) {
    if (local_88._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar3 = bcmp(local_88._M_dataplus._M_p,(rhs->_M_dataplus)._M_p,local_88._M_string_length);
      bVar2 = iVar3 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

inline bool node::equals(const T& rhs, shared_memory_holder pMemory) {
  T lhs;
  if (convert<T>::decode(Node(*this, pMemory), lhs)) {
    return lhs == rhs;
  }
  return false;
}